

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::multiplePatchReferenceVertexCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *levels,int numPatches)

{
  int iVar1;
  int local_2c;
  int local_28;
  int patchNdx;
  int result;
  int numPatches_local;
  float *levels_local;
  bool usePointMode_local;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  
  local_28 = 0;
  for (local_2c = 0; local_2c < numPatches; local_2c = local_2c + 1) {
    iVar1 = referenceVertexCount
                      (primitiveType,spacingMode,usePointMode,levels + local_2c * 6,
                       levels + (local_2c * 6 + 2));
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

static int multiplePatchReferenceVertexCount (TessPrimitiveType primitiveType, SpacingMode spacingMode, bool usePointMode, const float* levels, int numPatches)
{
	int result = 0;
	for (int patchNdx = 0; patchNdx < numPatches; patchNdx++)
		result += referenceVertexCount(primitiveType, spacingMode, usePointMode, &levels[6*patchNdx + 0], &levels[6*patchNdx + 2]);
	return result;
}